

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_geometric_normal_decoder.h
# Opt level: O0

void __thiscall
draco::
MeshPredictionSchemeGeometricNormalDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
::MeshPredictionSchemeGeometricNormalDecoder
          (MeshPredictionSchemeGeometricNormalDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
           *this,PointAttribute *attribute,
          PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int> *transform,
          MeshPredictionSchemeData<draco::CornerTable> *mesh_data)

{
  RAnsBitDecoder *in_RDI;
  MeshPredictionSchemeData<draco::CornerTable> *in_stack_ffffffffffffffb8;
  PointAttribute *in_stack_ffffffffffffffc8;
  MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
  *in_stack_ffffffffffffffd0;
  
  MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
  ::MeshPredictionSchemeDecoder
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
             (PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int> *)in_RDI,
             in_stack_ffffffffffffffb8);
  *(undefined ***)
   &(((PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int> *)&in_RDI->ans_decoder_)->
    super_PredictionSchemeNormalOctahedronTransformBase<int>).octahedron_tool_box_ =
       &PTR__MeshPredictionSchemeGeometricNormalDecoder_0032b3c0;
  MeshPredictionSchemeGeometricNormalPredictorArea<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
  ::MeshPredictionSchemeGeometricNormalPredictorArea
            ((MeshPredictionSchemeGeometricNormalPredictorArea<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
              *)in_stack_ffffffffffffffd0,
             (MeshPredictionSchemeData<draco::CornerTable> *)(in_RDI + 3));
  OctahedronToolBox::OctahedronToolBox((OctahedronToolBox *)&in_RDI[5].prob_zero_);
  RAnsBitDecoder::RAnsBitDecoder(in_RDI);
  return;
}

Assistant:

MeshPredictionSchemeGeometricNormalDecoder(const PointAttribute *attribute,
                                             const TransformT &transform,
                                             const MeshDataT &mesh_data)
      : MeshPredictionSchemeDecoder<DataTypeT, TransformT, MeshDataT>(
            attribute, transform, mesh_data),
        predictor_(mesh_data) {}